

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<std::error_code_()>::Action
          (Action<std::error_code_()> *this,ActionInterface<std::error_code_()> *impl)

{
  ActionAdapter local_28;
  ActionInterface<std::error_code_()> *local_18;
  ActionInterface<std::error_code_()> *impl_local;
  Action<std::error_code_()> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<std::error_code_()> *)this;
  std::shared_ptr<testing::ActionInterface<std::error_code()>>::
  shared_ptr<testing::ActionInterface<std::error_code()>,void>
            ((shared_ptr<testing::ActionInterface<std::error_code()>> *)&local_28,impl);
  std::function<std::error_code()>::function<testing::Action<std::error_code()>::ActionAdapter,void>
            ((function<std::error_code()> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}